

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O3

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,LinearFunctionalConstraint *con,double lb,double ub,Context ctx)

{
  CtxVal CVar1;
  Context CVar2;
  
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::NarrowVarBounds((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     *)this,(con->super_FunctionalConstraint).result_var_,lb,ub);
  CVar1 = (con->super_FunctionalConstraint).ctx.value_;
  if (CVar1 - CTX_ROOT < 2) {
    CVar2.value_ = CTX_MIX;
    if (1 < ctx.value_ - CTX_NEG) goto LAB_00193036;
  }
  else {
    CVar2.value_ = ctx.value_;
    if ((CVar1 != CTX_NONE) &&
       (((CVar1 != CTX_NEG || (CTX_MIX < ctx.value_)) ||
        (CVar2.value_ = CTX_MIX, (0x16U >> (ctx.value_ & 0x1f) & 1) == 0)))) goto LAB_00193036;
  }
  (con->super_FunctionalConstraint).ctx.value_ = CVar2.value_;
LAB_00193036:
  CVar2.value_ = CTX_POS;
  if (CTX_POS < ctx.value_) {
    CVar2.value_ = ctx.value_;
  }
  PropagateResult2LinTerms(this,&(con->affine_expr_).super_LinTerms,-INFINITY,INFINITY,CVar2);
  return;
}

Assistant:

void PropagateResult(LinearFunctionalConstraint& con, double lb, double ub,
                       Context ctx) {
    MPD( NarrowVarBounds(con.GetResultVar(), lb, ub) );
    con.AddContext(ctx);
    PropagateResult2LinTerms(con.GetAffineExpr(),   // @todo better in special cases
                             MPD( MinusInfty() ), MPD( Infty() ), +ctx);
  }